

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O2

Result<kernel::ChainstateManagerOpts> *
validation_chainstatemanager_tests::SetOptsFromArgs<kernel::ChainstateManagerOpts>
          (Result<kernel::ChainstateManagerOpts> *__return_storage_ptr__,ArgsManager *args_man,
          ChainstateManagerOpts opts,vector<const_char_*,_std::allocator<const_char_*>_> *args)

{
  long lVar1;
  string original;
  bool bVar2;
  Options *opts_00;
  long in_FS_OFFSET;
  initializer_list<const_char_*> __l;
  _Vector_impl_data in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffde0;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  ChainstateManagerOpts local_200;
  bilingual_str local_130;
  Result<void> result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  bilingual_str local_88;
  string error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
  super__Move_assign_alias<bilingual_str,_std::monostate>.
  super__Copy_assign_alias<bilingual_str,_std::monostate>.
  super__Move_ctor_alias<bilingual_str,_std::monostate>.
  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
       (long)"dec_ignore == in_ignore" + 0x11;
  __l._M_len = 1;
  __l._M_array = (iterator)&result;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xfffffffffffffdd0,__l,
             (allocator_type *)&error);
  Cat<std::vector<char_const*,std::allocator<char_const*>>>
            (&argv,(vector<const_char_*,_std::allocator<const_char_*>_>)in_stack_fffffffffffffdc8,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xfffffffffffffdd0);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xfffffffffffffdd0);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  opts_00 = (Options *)&error;
  bVar2 = ArgsManager::ParseParameters
                    (args_man,(int)((ulong)((long)argv.
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)argv.
                                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3),
                     argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start,(string *)opts_00);
  if (bVar2) {
    ::node::ApplyArgsManOptions(&result,(node *)args_man,(ArgsManager *)args,opts_00);
    if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index == '\x01') {
      kernel::ChainstateManagerOpts::ChainstateManagerOpts(&local_200,(ChainstateManagerOpts *)args)
      ;
      std::__detail::__variant::_Variant_storage<false,bilingual_str,kernel::ChainstateManagerOpts>
      ::_Variant_storage<1ul,kernel::ChainstateManagerOpts>
                ((_Variant_storage<false,bilingual_str,kernel::ChainstateManagerOpts> *)
                 __return_storage_ptr__,&local_200);
      std::filesystem::__cxx11::path::~path(&local_200.datadir.super_path);
    }
    else {
      util::ErrorString<void>(&local_130,&result);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,kernel::ChainstateManagerOpts>
      ::_Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,kernel::ChainstateManagerOpts> *)
                 __return_storage_ptr__,&local_130);
      bilingual_str::~bilingual_str(&local_130);
    }
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
  }
  else {
    std::operator+(&local_a8,"ParseParameters failed with error: ",&error);
    original.field_2._8_8_ = in_stack_fffffffffffffde0;
    original._0_24_ = in_stack_fffffffffffffdc8;
    Untranslated(&local_88,original);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,kernel::ChainstateManagerOpts>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,kernel::ChainstateManagerOpts> *)
               __return_storage_ptr__,&local_88);
    bilingual_str::~bilingual_str(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&error);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<Options> SetOptsFromArgs(ArgsManager& args_man, Options opts,
                                      const std::vector<const char*>& args)
{
    const auto argv{Cat({"ignore"}, args)};
    std::string error{};
    if (!args_man.ParseParameters(argv.size(), argv.data(), error)) {
        return util::Error{Untranslated("ParseParameters failed with error: " + error)};
    }
    const auto result{node::ApplyArgsManOptions(args_man, opts)};
    if (!result) return util::Error{util::ErrorString(result)};
    return opts;
}